

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O3

bool __thiscall ReqHandler::dispose(ReqHandler *this)

{
  if ((this->_segment).super_SegmentBase._isInited == true) {
    if ((this->_segment)._mpSeg.super_SegmentBase._isInited == true) {
      CppJieba::Trie::dispose(&(this->_segment)._mpSeg._trie);
      (this->_segment)._mpSeg.super_SegmentBase._isInited = false;
    }
    (this->_segment)._hmmSeg.super_SegmentBase._isInited = false;
    (this->_segment).super_SegmentBase._isInited = false;
  }
  return true;
}

Assistant:

virtual bool dispose()
            {
                if(!_getInitFlag())
                {
                    return true;
                }
                _mpSeg.dispose();
                _hmmSeg.dispose();
                _setInitFlag(false);
                return true;
            }